

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::finished(QNetworkReplyImplPrivate *this)

{
  long lVar1;
  QByteArrayView value;
  bool bVar2;
  QNetworkReplyImpl *this_00;
  QNetworkReplyImplPrivate *pQVar3;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  longlong totalSize;
  QNetworkReplyImpl *q;
  optional<long_long> totalSizeOpt;
  int *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8 [16];
  WellKnownHeader name;
  QNetworkReplyImplPrivate *this_01;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  QByteArrayView in_stack_ffffffffffffffd0;
  
  name = in_stack_ffffffffffffffa8._12_4_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = q_func(in_RDI);
  if ((in_RDI->state == Finished) || (in_RDI->state == Aborted)) goto LAB_001ea125;
  pauseNotificationHandling(in_RDI);
  QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)in_RDI);
  QByteArrayView::QByteArrayView((QByteArrayView *)&stack0xffffffffffffffd0);
  QVar4 = QHttpHeaders::value((QHttpHeaders *)this_00,name,in_stack_ffffffffffffffd0);
  value.m_data._0_4_ = in_stack_ffffffffffffffc8;
  value.m_size = (qsizetype)pQVar3;
  value.m_data._4_4_ = in_stack_ffffffffffffffcc;
  QNetworkHeadersPrivate::toInt(value);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x1e9ff5);
  pQVar3 = (QNetworkReplyImplPrivate *)
           std::optional<long_long>::value_or<int>
                     ((optional<long_long> *)QVar4.m_size,in_stack_ffffffffffffffa0);
  resumeNotificationHandling((QNetworkReplyImplPrivate *)QVar4.m_data);
  in_RDI->state = Finished;
  QNetworkReply::setFinished((QNetworkReply *)pQVar3,SUB81((ulong)in_RDI >> 0x38,0));
  std::
  vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
  ::clear((vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
           *)0x1ea047);
  pauseNotificationHandling(in_RDI);
  if (pQVar3 == (QNetworkReplyImplPrivate *)0xffffffffffffffff) {
    QNetworkReply::downloadProgress((QNetworkReply *)in_RDI,QVar4.m_size,-1);
  }
  else {
    QNetworkReply::downloadProgress((QNetworkReply *)in_RDI,QVar4.m_size,(qint64)pQVar3);
  }
  this_01 = (QNetworkReplyImplPrivate *)QVar4.m_data;
  if (in_RDI->bytesUploaded == -1) {
    if (in_RDI->outgoingData == (QIODevice *)0x0) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->outgoingDataBuffer);
      this_01 = (QNetworkReplyImplPrivate *)QVar4.m_data;
      if (!bVar2) goto LAB_001ea0d3;
    }
    this_01 = (QNetworkReplyImplPrivate *)QVar4.m_data;
    QNetworkReply::uploadProgress((QNetworkReply *)in_RDI,QVar4.m_size,(qint64)pQVar3);
  }
LAB_001ea0d3:
  resumeNotificationHandling(this_01);
  if ((pQVar3 == (QNetworkReplyImplPrivate *)0xffffffffffffffff) ||
     ((QNetworkReplyImplPrivate *)in_RDI->bytesDownloaded == pQVar3)) {
    completeCacheSave(pQVar3);
  }
  pauseNotificationHandling(in_RDI);
  QIODevice::readChannelFinished();
  QNetworkReply::finished((QNetworkReply *)0x1ea11c);
  resumeNotificationHandling(this_01);
LAB_001ea125:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyImplPrivate::finished()
{
    Q_Q(QNetworkReplyImpl);

    if (state == Finished || state == Aborted)
        return;

    pauseNotificationHandling();
    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
    const auto totalSize = totalSizeOpt.value_or(-1);

    resumeNotificationHandling();

    state = Finished;
    q->setFinished(true);

    pendingNotifications.clear();

    pauseNotificationHandling();
    if (totalSize == -1) {
        emit q->downloadProgress(bytesDownloaded, bytesDownloaded);
    } else {
        emit q->downloadProgress(bytesDownloaded, totalSize);
    }

    if (bytesUploaded == -1 && (outgoingData || outgoingDataBuffer))
        emit q->uploadProgress(0, 0);
    resumeNotificationHandling();

    // if we don't know the total size of or we received everything save the cache
    if (totalSize == -1 || bytesDownloaded == totalSize)
        completeCacheSave();

    // note: might not be a good idea, since users could decide to delete us
    // which would delete the backend too...
    // maybe we should protect the backend
    pauseNotificationHandling();
    emit q->readChannelFinished();
    emit q->finished();
    resumeNotificationHandling();
}